

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpint.c
# Opt level: O1

void mp_add_integer_into(mp_int *r,mp_int *a,uintmax_t n)

{
  size_t sVar1;
  BignumInt *pBVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  BignumInt BVar7;
  
  sVar1 = r->nw;
  if (sVar1 != 0) {
    pBVar2 = r->w;
    uVar3 = a->nw;
    uVar5 = 0;
    uVar6 = 0;
    do {
      if (uVar6 < uVar3) {
        BVar7 = a->w[uVar6];
      }
      else {
        BVar7 = 0;
      }
      uVar4 = uVar5 + n;
      uVar5 = (ulong)CARRY8(uVar5,n) + (ulong)CARRY8(uVar4,BVar7);
      if (pBVar2 != (BignumInt *)0x0) {
        pBVar2[uVar6] = uVar4 + BVar7;
      }
      uVar6 = uVar6 + 1;
      n = 0;
    } while (sVar1 != uVar6);
  }
  return;
}

Assistant:

void mp_add_integer_into(mp_int *r, mp_int *a, uintmax_t n)
{
    mp_add_masked_integer_into(r->w, r->nw, a, n, ~(BignumInt)0, 0, 0);
}